

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2a21b2d::LowBDConvolveHorizRSTest_DISABLED_Speed_Test::TestBody
          (LowBDConvolveHorizRSTest_DISABLED_Speed_Test *this)

{
  __suseconds_t _Var1;
  TestImage<unsigned_char> *this_00;
  ostream *poVar2;
  void **val2;
  long lVar3;
  undefined8 *puVar4;
  int iVar5;
  SEARCH_METHODS *pSVar6;
  AssertionResult gtest_ar_1;
  int64_t ref_time;
  int64_t tst_time;
  aom_usec_timer tst_timer;
  ACMRandom rnd;
  aom_usec_timer ref_timer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  AssertHelper local_90;
  undefined8 *local_88;
  long local_80;
  long local_78;
  timeval local_70;
  timeval local_60;
  ACMRandom local_4c;
  timeval local_48;
  timeval local_38;
  
  this_00 = (TestImage<unsigned_char> *)operator_new(0x50);
  val2 = (void **)0xd;
  TestImage<unsigned_char>::TestImage
            (this_00,0x81,0x2ff,0xd,0x1fff,
             (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.bd_
            );
  (this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.image_ =
       this_00;
  local_70.tv_sec = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::TestImage<unsigned_char>*,decltype(nullptr)>
            ((char *)&local_48,
             (char *)&(this->super_LowBDConvolveHorizRSTest).
                      super_ConvolveHorizRSTestBase<unsigned_char>.image_,
             (TestImage<unsigned_char> **)&local_70,val2);
  _Var1 = local_48.tv_usec;
  if ((char)local_48.tv_sec == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((undefined8 *)local_48.tv_usec == (undefined8 *)0x0) {
      pSVar6 = "";
    }
    else {
      pSVar6 = *(SEARCH_METHODS **)local_48.tv_usec;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
               ,0xe1,(char *)pSVar6);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    puVar4 = (undefined8 *)local_48.tv_usec;
    if ((long *)local_70.tv_sec != (long *)0x0) {
      (**(code **)(*(long *)local_70.tv_sec + 8))();
      puVar4 = (undefined8 *)local_48.tv_usec;
    }
  }
  else {
    if ((undefined8 *)local_48.tv_usec != (undefined8 *)0x0) {
      if (*(undefined8 **)local_48.tv_usec != (undefined8 *)(local_48.tv_usec + 0x10)) {
        operator_delete(*(undefined8 **)local_48.tv_usec);
      }
      operator_delete((void *)_Var1);
    }
    local_4c.random_.state_ = (Random)0xbaba;
    ConvolveHorizRSTestBase<unsigned_char>::Prep
              ((ConvolveHorizRSTestBase<unsigned_char> *)this,&local_4c);
    gettimeofday(&local_48,(__timezone_ptr_t)0x0);
    iVar5 = 1000;
    do {
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    lVar3 = local_38.tv_usec - local_48.tv_usec;
    local_80 = lVar3 + 1000000;
    if (-1 < lVar3) {
      local_80 = lVar3;
    }
    local_80 = ((lVar3 >> 0x3f) +
               (local_38.tv_sec - CONCAT71(local_48.tv_sec._1_7_,(char)local_48.tv_sec))) * 1000000
               + local_80;
    gettimeofday(&local_70,(__timezone_ptr_t)0x0);
    iVar5 = 1000;
    do {
      (*(this->super_LowBDConvolveHorizRSTest).super_ConvolveHorizRSTestBase<unsigned_char>.
        super_Test._vptr_Test[6])(this);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    lVar3 = local_60.tv_usec - local_70.tv_usec;
    local_78 = lVar3 + 1000000;
    if (-1 < lVar3) {
      local_78 = lVar3;
    }
    local_78 = ((lVar3 >> 0x3f) + (local_60.tv_sec - local_70.tv_sec)) * 1000000 + local_78;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[          ] C time = ",0x16);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ms, SIMD time = ",0x11);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ms\n",4);
    testing::internal::CmpHelperGT<long,long>
              ((internal *)&local_90,"ref_time","tst_time",&local_80,&local_78);
    puVar4 = local_88;
    if (local_90.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_a0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10),
                 "Error: ConvolveHorizRSTest (Speed Test), SIMD slower than C.\n",0x3d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10),"C time: ",8);
      std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10)," us\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10),"SIMD time: ",0xb);
      std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_a0._M_head_impl + 0x10)," us\n",4);
      if (local_88 == (undefined8 *)0x0) {
        pSVar6 = "";
      }
      else {
        pSVar6 = (SEARCH_METHODS *)*local_88;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_horz_only_frame_superres_test.cc"
                 ,0xf5,(char *)pSVar6);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      puVar4 = local_88;
      if (local_a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a0._M_head_impl + 8))();
        puVar4 = local_88;
      }
    }
  }
  if (puVar4 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar4 != puVar4 + 2) {
      operator_delete((undefined8 *)*puVar4);
    }
    operator_delete(puVar4);
  }
  return;
}

Assistant:

TEST_P(LowBDConvolveHorizRSTest, DISABLED_Speed) { SpeedTest(); }